

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O0

void __thiscall dlib::directory::directory(directory *this,char *name)

{
  char *in_RSI;
  data *in_RDI;
  allocator local_31;
  string local_30 [32];
  char *local_10;
  
  local_10 = in_RSI;
  data::data(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,local_10,&local_31);
  init((directory *)in_RDI,(EVP_PKEY_CTX *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

directory (
            const char* name
        ) { init(name); }